

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_default::statement_default
          (statement_default *this,
          deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b,context_t *c,
          token_base *ptr)

{
  _func_int **pp_Var1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RDX;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RSI;
  statement_base *in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff28;
  token_base *in_stack_ffffffffffffff30;
  context_t *c_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  context_t *in_stack_ffffffffffffff70;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff78;
  statement_block *in_stack_ffffffffffffff80;
  context_t local_30;
  
  c_00 = &local_30;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  statement_base::statement_base(in_RDI,c_00,in_stack_ffffffffffffff30);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x257a9f);
  in_RDI->_vptr_statement_base = (_func_int **)&PTR__statement_default_003e1138;
  pp_Var1 = (_func_int **)statement_base::operator_new((size_t)in_stack_ffffffffffffff30);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque(in_RSI,in_RDX);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)&stack0xffffffffffffff60,in_stack_ffffffffffffff28);
  statement_block::statement_block
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (token_base *)in_stack_ffffffffffffff68._M_pi);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x257b29);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff80);
  in_RDI[1]._vptr_statement_base = pp_Var1;
  return;
}

Assistant:

statement_default(const std::deque<statement_base *> &b, const context_t &c, token_base *ptr) : statement_base(
			    c, ptr),
			mBlock(new statement_block(
			           b, c,
			           ptr)) {}